

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int If_CutDelayRecCost3(If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pObj)

{
  int iVar1;
  uint local_3c;
  char local_38 [4];
  uint uCanonPhase;
  char pCanonPerm [16];
  Lms_Man_t *p;
  If_Obj_t *pObj_local;
  If_Cut_t *pCut_local;
  If_Man_t *pIfMan_local;
  
  pCanonPerm._8_8_ = s_pMan3;
  local_3c = 0;
  if (s_pMan3->nVars != (*(uint *)&pCut->field_0x1c >> 0x10 & 0xff)) {
    __assert_fail("p->nVars == (int)pCut->nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x3f2,"int If_CutDelayRecCost3(If_Man_t *, If_Cut_t *, If_Obj_t *)");
  }
  if (s_pMan3->fLibConstr == 0) {
    if (s_pMan3->vTruthPo == (Vec_Int_t *)0x0) {
      Lms_ManPrepare(s_pMan3);
    }
    iVar1 = If_CutFindBestStruct(pIfMan,pCut,local_38,&local_3c,(int *)0x0);
    return iVar1;
  }
  __assert_fail("!p->fLibConstr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x3f5,"int If_CutDelayRecCost3(If_Man_t *, If_Cut_t *, If_Obj_t *)");
}

Assistant:

int If_CutDelayRecCost3( If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    // make sure the cut functions match the library
    assert( p->nVars == (int)pCut->nLimit );
    // if this assertion fires, it means that LMS manager was used for library construction
    // in this case, GIA has to be written out and the manager restarted as described above
    assert( !p->fLibConstr );
    if ( p->vTruthPo == NULL )
        Lms_ManPrepare( p );
    // return the delay of the best structure
    return If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, NULL );
}